

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_LOOP(Context *ctx)

{
  char *pcVar1;
  
  if (ctx->source_args[0].regtype == REG_TYPE_LOOP) {
    if (ctx->source_args[1].regtype == REG_TYPE_CONSTINT) {
      ctx->loops = ctx->loops + 1;
      return;
    }
    pcVar1 = "LOOP argument isn\'t constint register";
  }
  else {
    pcVar1 = "LOOP argument isn\'t loop register";
  }
  failf(ctx,"%s",pcVar1);
  return;
}

Assistant:

static void state_LOOP(Context *ctx)
{
    if (ctx->source_args[0].regtype != REG_TYPE_LOOP)
        fail(ctx, "LOOP argument isn't loop register");
    else if (ctx->source_args[1].regtype != REG_TYPE_CONSTINT)
        fail(ctx, "LOOP argument isn't constint register");
    else
        ctx->loops++;
}